

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# banner.cpp
# Opt level: O0

bool MakeBanner(path *specfile_path,path *outfile_path)

{
  basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> *pbVar1;
  byte bVar2;
  value_type *pvVar3;
  iterator iVar4;
  iterator iVar5;
  pointer pvVar6;
  pointer banner_data;
  bool bVar7;
  path local_ef8;
  IconPalette local_ed0;
  path local_eb0;
  IconBitmap local_e88;
  undefined1 local_c88 [8];
  Banner banner;
  runtime_error *e;
  undefined1 local_338 [8];
  SpecFileData specfile_data;
  ofstream local_220 [8];
  ofstream ostream;
  path *outfile_path_local;
  path *specfile_path_local;
  
  std::ofstream::ofstream<std::filesystem::__cxx11::path,std::filesystem::__cxx11::path>
            (local_220,outfile_path,_S_bin);
  bVar2 = std::ofstream::is_open();
  bVar7 = (bVar2 & 1) != 0;
  if (bVar7) {
    local_338._0_2_ = 0;
    std::__cxx11::wstring::wstring((wstring *)&specfile_data);
    std::__cxx11::wstring::wstring((wstring *)&specfile_data.field_0x20);
    std::__cxx11::u16string::u16string((u16string *)&specfile_data.field_0x40);
    std::__cxx11::u16string::u16string
              ((u16string *)((long)&specfile_data.japanese_title.field_2 + 8));
    std::__cxx11::u16string::u16string
              ((u16string *)((long)&specfile_data.english_title.field_2 + 8));
    std::__cxx11::u16string::u16string((u16string *)((long)&specfile_data.french_title.field_2 + 8))
    ;
    std::__cxx11::u16string::u16string((u16string *)((long)&specfile_data.german_title.field_2 + 8))
    ;
    std::__cxx11::u16string::u16string
              ((u16string *)((long)&specfile_data.italian_title.field_2 + 8));
    ParseSpecFile((SpecFileData *)&e,specfile_path);
    SpecFileData::operator=((SpecFileData *)local_338,(SpecFileData *)&e);
    SpecFileData::~SpecFileData((SpecFileData *)&e);
    local_c88._0_2_ = 0;
    local_c88._2_2_ = 0;
    banner.version = 0;
    local_c88._4_2_ = 0;
    local_c88._6_2_ = 0;
    banner.crc = 0;
    banner.crc_padding._M_elems[0] = 0;
    banner.crc_padding._M_elems[1] = 0;
    banner.crc_padding._M_elems[2] = 0;
    banner.padding._M_elems[0] = '\0';
    banner.padding._M_elems[1] = '\0';
    banner.padding._M_elems[2] = '\0';
    banner.padding._M_elems[3] = '\0';
    banner.padding._M_elems[4] = '\0';
    banner.padding._M_elems[5] = '\0';
    banner.padding._M_elems[6] = '\0';
    banner.padding._M_elems[7] = '\0';
    banner.padding._M_elems[8] = '\0';
    banner.padding._M_elems[9] = '\0';
    banner.padding._M_elems[10] = '\0';
    banner.padding._M_elems[0xb] = '\0';
    banner.padding._M_elems[0xc] = '\0';
    banner.padding._M_elems[0xd] = '\0';
    memset(banner.padding._M_elems + 0xe,0,0x200);
    banner.palette._M_elems[8] = '\0';
    banner.palette._M_elems[9] = '\0';
    banner.palette._M_elems[10] = '\0';
    banner.palette._M_elems[0xb] = '\0';
    banner.palette._M_elems[0xc] = '\0';
    banner.palette._M_elems[0xd] = '\0';
    banner.palette._M_elems[0xe] = '\0';
    banner.palette._M_elems[0xf] = '\0';
    banner.palette._M_elems[0x10] = '\0';
    banner.palette._M_elems[0x11] = '\0';
    banner.palette._M_elems[0x12] = '\0';
    banner.palette._M_elems[0x13] = '\0';
    banner.palette._M_elems[0x14] = '\0';
    banner.palette._M_elems[0x15] = '\0';
    banner.palette._M_elems[0x16] = '\0';
    banner.palette._M_elems[0x17] = '\0';
    banner.bitmap._M_elems[0x1f8] = '\0';
    banner.bitmap._M_elems[0x1f9] = '\0';
    banner.bitmap._M_elems[0x1fa] = '\0';
    banner.bitmap._M_elems[0x1fb] = '\0';
    banner.bitmap._M_elems[0x1fc] = '\0';
    banner.bitmap._M_elems[0x1fd] = '\0';
    banner.bitmap._M_elems[0x1fe] = '\0';
    banner.bitmap._M_elems[0x1ff] = '\0';
    banner.palette._M_elems[0] = '\0';
    banner.palette._M_elems[1] = '\0';
    banner.palette._M_elems[2] = '\0';
    banner.palette._M_elems[3] = '\0';
    banner.palette._M_elems[4] = '\0';
    banner.palette._M_elems[5] = '\0';
    banner.palette._M_elems[6] = '\0';
    banner.palette._M_elems[7] = '\0';
    banner.japanese_title._M_elems[0x74] = 0;
    banner.japanese_title._M_elems[0x75] = 0;
    banner.japanese_title._M_elems[0x76] = 0;
    banner.japanese_title._M_elems[0x77] = 0;
    banner.japanese_title._M_elems[0x78] = 0;
    banner.japanese_title._M_elems[0x79] = 0;
    banner.japanese_title._M_elems[0x7a] = 0;
    banner.japanese_title._M_elems[0x7b] = 0;
    banner.japanese_title._M_elems[0x6c] = 0;
    banner.japanese_title._M_elems[0x6d] = 0;
    banner.japanese_title._M_elems[0x6e] = 0;
    banner.japanese_title._M_elems[0x6f] = 0;
    banner.japanese_title._M_elems[0x70] = 0;
    banner.japanese_title._M_elems[0x71] = 0;
    banner.japanese_title._M_elems[0x72] = 0;
    banner.japanese_title._M_elems[0x73] = 0;
    banner.japanese_title._M_elems[100] = 0;
    banner.japanese_title._M_elems[0x65] = 0;
    banner.japanese_title._M_elems[0x66] = 0;
    banner.japanese_title._M_elems[0x67] = 0;
    banner.japanese_title._M_elems[0x68] = 0;
    banner.japanese_title._M_elems[0x69] = 0;
    banner.japanese_title._M_elems[0x6a] = 0;
    banner.japanese_title._M_elems[0x6b] = 0;
    banner.japanese_title._M_elems[0x5c] = 0;
    banner.japanese_title._M_elems[0x5d] = 0;
    banner.japanese_title._M_elems[0x5e] = 0;
    banner.japanese_title._M_elems[0x5f] = 0;
    banner.japanese_title._M_elems[0x60] = 0;
    banner.japanese_title._M_elems[0x61] = 0;
    banner.japanese_title._M_elems[0x62] = 0;
    banner.japanese_title._M_elems[99] = 0;
    banner.japanese_title._M_elems[0x54] = 0;
    banner.japanese_title._M_elems[0x55] = 0;
    banner.japanese_title._M_elems[0x56] = 0;
    banner.japanese_title._M_elems[0x57] = 0;
    banner.japanese_title._M_elems[0x58] = 0;
    banner.japanese_title._M_elems[0x59] = 0;
    banner.japanese_title._M_elems[0x5a] = 0;
    banner.japanese_title._M_elems[0x5b] = 0;
    banner.japanese_title._M_elems[0x4c] = 0;
    banner.japanese_title._M_elems[0x4d] = 0;
    banner.japanese_title._M_elems[0x4e] = 0;
    banner.japanese_title._M_elems[0x4f] = 0;
    banner.japanese_title._M_elems[0x50] = 0;
    banner.japanese_title._M_elems[0x51] = 0;
    banner.japanese_title._M_elems[0x52] = 0;
    banner.japanese_title._M_elems[0x53] = 0;
    banner.japanese_title._M_elems[0x44] = 0;
    banner.japanese_title._M_elems[0x45] = 0;
    banner.japanese_title._M_elems[0x46] = 0;
    banner.japanese_title._M_elems[0x47] = 0;
    banner.japanese_title._M_elems[0x48] = 0;
    banner.japanese_title._M_elems[0x49] = 0;
    banner.japanese_title._M_elems[0x4a] = 0;
    banner.japanese_title._M_elems[0x4b] = 0;
    banner.japanese_title._M_elems[0x3c] = 0;
    banner.japanese_title._M_elems[0x3d] = 0;
    banner.japanese_title._M_elems[0x3e] = 0;
    banner.japanese_title._M_elems[0x3f] = 0;
    banner.japanese_title._M_elems[0x40] = 0;
    banner.japanese_title._M_elems[0x41] = 0;
    banner.japanese_title._M_elems[0x42] = 0;
    banner.japanese_title._M_elems[0x43] = 0;
    banner.japanese_title._M_elems[0x34] = 0;
    banner.japanese_title._M_elems[0x35] = 0;
    banner.japanese_title._M_elems[0x36] = 0;
    banner.japanese_title._M_elems[0x37] = 0;
    banner.japanese_title._M_elems[0x38] = 0;
    banner.japanese_title._M_elems[0x39] = 0;
    banner.japanese_title._M_elems[0x3a] = 0;
    banner.japanese_title._M_elems[0x3b] = 0;
    banner.japanese_title._M_elems[0x2c] = 0;
    banner.japanese_title._M_elems[0x2d] = 0;
    banner.japanese_title._M_elems[0x2e] = 0;
    banner.japanese_title._M_elems[0x2f] = 0;
    banner.japanese_title._M_elems[0x30] = 0;
    banner.japanese_title._M_elems[0x31] = 0;
    banner.japanese_title._M_elems[0x32] = 0;
    banner.japanese_title._M_elems[0x33] = 0;
    banner.japanese_title._M_elems[0x24] = 0;
    banner.japanese_title._M_elems[0x25] = 0;
    banner.japanese_title._M_elems[0x26] = 0;
    banner.japanese_title._M_elems[0x27] = 0;
    banner.japanese_title._M_elems[0x28] = 0;
    banner.japanese_title._M_elems[0x29] = 0;
    banner.japanese_title._M_elems[0x2a] = 0;
    banner.japanese_title._M_elems[0x2b] = 0;
    banner.japanese_title._M_elems[0x1c] = 0;
    banner.japanese_title._M_elems[0x1d] = 0;
    banner.japanese_title._M_elems[0x1e] = 0;
    banner.japanese_title._M_elems[0x1f] = 0;
    banner.japanese_title._M_elems[0x20] = 0;
    banner.japanese_title._M_elems[0x21] = 0;
    banner.japanese_title._M_elems[0x22] = 0;
    banner.japanese_title._M_elems[0x23] = 0;
    banner.japanese_title._M_elems[0x14] = 0;
    banner.japanese_title._M_elems[0x15] = 0;
    banner.japanese_title._M_elems[0x16] = 0;
    banner.japanese_title._M_elems[0x17] = 0;
    banner.japanese_title._M_elems[0x18] = 0;
    banner.japanese_title._M_elems[0x19] = 0;
    banner.japanese_title._M_elems[0x1a] = 0;
    banner.japanese_title._M_elems[0x1b] = 0;
    banner.japanese_title._M_elems[0xc] = 0;
    banner.japanese_title._M_elems[0xd] = 0;
    banner.japanese_title._M_elems[0xe] = 0;
    banner.japanese_title._M_elems[0xf] = 0;
    banner.japanese_title._M_elems[0x10] = 0;
    banner.japanese_title._M_elems[0x11] = 0;
    banner.japanese_title._M_elems[0x12] = 0;
    banner.japanese_title._M_elems[0x13] = 0;
    banner.japanese_title._M_elems[4] = 0;
    banner.japanese_title._M_elems[5] = 0;
    banner.japanese_title._M_elems[6] = 0;
    banner.japanese_title._M_elems[7] = 0;
    banner.japanese_title._M_elems[8] = 0;
    banner.japanese_title._M_elems[9] = 0;
    banner.japanese_title._M_elems[10] = 0;
    banner.japanese_title._M_elems[0xb] = 0;
    banner.palette._M_elems[0x18] = '\0';
    banner.palette._M_elems[0x19] = '\0';
    banner.palette._M_elems[0x1a] = '\0';
    banner.palette._M_elems[0x1b] = '\0';
    banner.palette._M_elems[0x1c] = '\0';
    banner.palette._M_elems[0x1d] = '\0';
    banner.palette._M_elems[0x1e] = '\0';
    banner.palette._M_elems[0x1f] = '\0';
    banner.japanese_title._M_elems[0] = 0;
    banner.japanese_title._M_elems[1] = 0;
    banner.japanese_title._M_elems[2] = 0;
    banner.japanese_title._M_elems[3] = 0;
    banner.english_title._M_elems[0x74] = 0;
    banner.english_title._M_elems[0x75] = 0;
    banner.english_title._M_elems[0x76] = 0;
    banner.english_title._M_elems[0x77] = 0;
    banner.english_title._M_elems[0x78] = 0;
    banner.english_title._M_elems[0x79] = 0;
    banner.english_title._M_elems[0x7a] = 0;
    banner.english_title._M_elems[0x7b] = 0;
    banner.english_title._M_elems[0x6c] = 0;
    banner.english_title._M_elems[0x6d] = 0;
    banner.english_title._M_elems[0x6e] = 0;
    banner.english_title._M_elems[0x6f] = 0;
    banner.english_title._M_elems[0x70] = 0;
    banner.english_title._M_elems[0x71] = 0;
    banner.english_title._M_elems[0x72] = 0;
    banner.english_title._M_elems[0x73] = 0;
    banner.english_title._M_elems[100] = 0;
    banner.english_title._M_elems[0x65] = 0;
    banner.english_title._M_elems[0x66] = 0;
    banner.english_title._M_elems[0x67] = 0;
    banner.english_title._M_elems[0x68] = 0;
    banner.english_title._M_elems[0x69] = 0;
    banner.english_title._M_elems[0x6a] = 0;
    banner.english_title._M_elems[0x6b] = 0;
    banner.english_title._M_elems[0x5c] = 0;
    banner.english_title._M_elems[0x5d] = 0;
    banner.english_title._M_elems[0x5e] = 0;
    banner.english_title._M_elems[0x5f] = 0;
    banner.english_title._M_elems[0x60] = 0;
    banner.english_title._M_elems[0x61] = 0;
    banner.english_title._M_elems[0x62] = 0;
    banner.english_title._M_elems[99] = 0;
    banner.english_title._M_elems[0x54] = 0;
    banner.english_title._M_elems[0x55] = 0;
    banner.english_title._M_elems[0x56] = 0;
    banner.english_title._M_elems[0x57] = 0;
    banner.english_title._M_elems[0x58] = 0;
    banner.english_title._M_elems[0x59] = 0;
    banner.english_title._M_elems[0x5a] = 0;
    banner.english_title._M_elems[0x5b] = 0;
    banner.english_title._M_elems[0x4c] = 0;
    banner.english_title._M_elems[0x4d] = 0;
    banner.english_title._M_elems[0x4e] = 0;
    banner.english_title._M_elems[0x4f] = 0;
    banner.english_title._M_elems[0x50] = 0;
    banner.english_title._M_elems[0x51] = 0;
    banner.english_title._M_elems[0x52] = 0;
    banner.english_title._M_elems[0x53] = 0;
    banner.english_title._M_elems[0x44] = 0;
    banner.english_title._M_elems[0x45] = 0;
    banner.english_title._M_elems[0x46] = 0;
    banner.english_title._M_elems[0x47] = 0;
    banner.english_title._M_elems[0x48] = 0;
    banner.english_title._M_elems[0x49] = 0;
    banner.english_title._M_elems[0x4a] = 0;
    banner.english_title._M_elems[0x4b] = 0;
    banner.english_title._M_elems[0x3c] = 0;
    banner.english_title._M_elems[0x3d] = 0;
    banner.english_title._M_elems[0x3e] = 0;
    banner.english_title._M_elems[0x3f] = 0;
    banner.english_title._M_elems[0x40] = 0;
    banner.english_title._M_elems[0x41] = 0;
    banner.english_title._M_elems[0x42] = 0;
    banner.english_title._M_elems[0x43] = 0;
    banner.english_title._M_elems[0x34] = 0;
    banner.english_title._M_elems[0x35] = 0;
    banner.english_title._M_elems[0x36] = 0;
    banner.english_title._M_elems[0x37] = 0;
    banner.english_title._M_elems[0x38] = 0;
    banner.english_title._M_elems[0x39] = 0;
    banner.english_title._M_elems[0x3a] = 0;
    banner.english_title._M_elems[0x3b] = 0;
    banner.english_title._M_elems[0x2c] = 0;
    banner.english_title._M_elems[0x2d] = 0;
    banner.english_title._M_elems[0x2e] = 0;
    banner.english_title._M_elems[0x2f] = 0;
    banner.english_title._M_elems[0x30] = 0;
    banner.english_title._M_elems[0x31] = 0;
    banner.english_title._M_elems[0x32] = 0;
    banner.english_title._M_elems[0x33] = 0;
    banner.english_title._M_elems[0x24] = 0;
    banner.english_title._M_elems[0x25] = 0;
    banner.english_title._M_elems[0x26] = 0;
    banner.english_title._M_elems[0x27] = 0;
    banner.english_title._M_elems[0x28] = 0;
    banner.english_title._M_elems[0x29] = 0;
    banner.english_title._M_elems[0x2a] = 0;
    banner.english_title._M_elems[0x2b] = 0;
    banner.english_title._M_elems[0x1c] = 0;
    banner.english_title._M_elems[0x1d] = 0;
    banner.english_title._M_elems[0x1e] = 0;
    banner.english_title._M_elems[0x1f] = 0;
    banner.english_title._M_elems[0x20] = 0;
    banner.english_title._M_elems[0x21] = 0;
    banner.english_title._M_elems[0x22] = 0;
    banner.english_title._M_elems[0x23] = 0;
    banner.english_title._M_elems[0x14] = 0;
    banner.english_title._M_elems[0x15] = 0;
    banner.english_title._M_elems[0x16] = 0;
    banner.english_title._M_elems[0x17] = 0;
    banner.english_title._M_elems[0x18] = 0;
    banner.english_title._M_elems[0x19] = 0;
    banner.english_title._M_elems[0x1a] = 0;
    banner.english_title._M_elems[0x1b] = 0;
    banner.english_title._M_elems[0xc] = 0;
    banner.english_title._M_elems[0xd] = 0;
    banner.english_title._M_elems[0xe] = 0;
    banner.english_title._M_elems[0xf] = 0;
    banner.english_title._M_elems[0x10] = 0;
    banner.english_title._M_elems[0x11] = 0;
    banner.english_title._M_elems[0x12] = 0;
    banner.english_title._M_elems[0x13] = 0;
    banner.english_title._M_elems[4] = 0;
    banner.english_title._M_elems[5] = 0;
    banner.english_title._M_elems[6] = 0;
    banner.english_title._M_elems[7] = 0;
    banner.english_title._M_elems[8] = 0;
    banner.english_title._M_elems[9] = 0;
    banner.english_title._M_elems[10] = 0;
    banner.english_title._M_elems[0xb] = 0;
    banner.japanese_title._M_elems[0x7c] = 0;
    banner.japanese_title._M_elems[0x7d] = 0;
    banner.japanese_title._M_elems[0x7e] = 0;
    banner.japanese_title._M_elems[0x7f] = 0;
    banner.english_title._M_elems[0] = 0;
    banner.english_title._M_elems[1] = 0;
    banner.english_title._M_elems[2] = 0;
    banner.english_title._M_elems[3] = 0;
    banner.french_title._M_elems[0x74] = 0;
    banner.french_title._M_elems[0x75] = 0;
    banner.french_title._M_elems[0x76] = 0;
    banner.french_title._M_elems[0x77] = 0;
    banner.french_title._M_elems[0x78] = 0;
    banner.french_title._M_elems[0x79] = 0;
    banner.french_title._M_elems[0x7a] = 0;
    banner.french_title._M_elems[0x7b] = 0;
    banner.french_title._M_elems[0x6c] = 0;
    banner.french_title._M_elems[0x6d] = 0;
    banner.french_title._M_elems[0x6e] = 0;
    banner.french_title._M_elems[0x6f] = 0;
    banner.french_title._M_elems[0x70] = 0;
    banner.french_title._M_elems[0x71] = 0;
    banner.french_title._M_elems[0x72] = 0;
    banner.french_title._M_elems[0x73] = 0;
    banner.french_title._M_elems[100] = 0;
    banner.french_title._M_elems[0x65] = 0;
    banner.french_title._M_elems[0x66] = 0;
    banner.french_title._M_elems[0x67] = 0;
    banner.french_title._M_elems[0x68] = 0;
    banner.french_title._M_elems[0x69] = 0;
    banner.french_title._M_elems[0x6a] = 0;
    banner.french_title._M_elems[0x6b] = 0;
    banner.french_title._M_elems[0x5c] = 0;
    banner.french_title._M_elems[0x5d] = 0;
    banner.french_title._M_elems[0x5e] = 0;
    banner.french_title._M_elems[0x5f] = 0;
    banner.french_title._M_elems[0x60] = 0;
    banner.french_title._M_elems[0x61] = 0;
    banner.french_title._M_elems[0x62] = 0;
    banner.french_title._M_elems[99] = 0;
    banner.french_title._M_elems[0x54] = 0;
    banner.french_title._M_elems[0x55] = 0;
    banner.french_title._M_elems[0x56] = 0;
    banner.french_title._M_elems[0x57] = 0;
    banner.french_title._M_elems[0x58] = 0;
    banner.french_title._M_elems[0x59] = 0;
    banner.french_title._M_elems[0x5a] = 0;
    banner.french_title._M_elems[0x5b] = 0;
    banner.french_title._M_elems[0x4c] = 0;
    banner.french_title._M_elems[0x4d] = 0;
    banner.french_title._M_elems[0x4e] = 0;
    banner.french_title._M_elems[0x4f] = 0;
    banner.french_title._M_elems[0x50] = 0;
    banner.french_title._M_elems[0x51] = 0;
    banner.french_title._M_elems[0x52] = 0;
    banner.french_title._M_elems[0x53] = 0;
    banner.french_title._M_elems[0x44] = 0;
    banner.french_title._M_elems[0x45] = 0;
    banner.french_title._M_elems[0x46] = 0;
    banner.french_title._M_elems[0x47] = 0;
    banner.french_title._M_elems[0x48] = 0;
    banner.french_title._M_elems[0x49] = 0;
    banner.french_title._M_elems[0x4a] = 0;
    banner.french_title._M_elems[0x4b] = 0;
    banner.french_title._M_elems[0x3c] = 0;
    banner.french_title._M_elems[0x3d] = 0;
    banner.french_title._M_elems[0x3e] = 0;
    banner.french_title._M_elems[0x3f] = 0;
    banner.french_title._M_elems[0x40] = 0;
    banner.french_title._M_elems[0x41] = 0;
    banner.french_title._M_elems[0x42] = 0;
    banner.french_title._M_elems[0x43] = 0;
    banner.french_title._M_elems[0x34] = 0;
    banner.french_title._M_elems[0x35] = 0;
    banner.french_title._M_elems[0x36] = 0;
    banner.french_title._M_elems[0x37] = 0;
    banner.french_title._M_elems[0x38] = 0;
    banner.french_title._M_elems[0x39] = 0;
    banner.french_title._M_elems[0x3a] = 0;
    banner.french_title._M_elems[0x3b] = 0;
    banner.french_title._M_elems[0x2c] = 0;
    banner.french_title._M_elems[0x2d] = 0;
    banner.french_title._M_elems[0x2e] = 0;
    banner.french_title._M_elems[0x2f] = 0;
    banner.french_title._M_elems[0x30] = 0;
    banner.french_title._M_elems[0x31] = 0;
    banner.french_title._M_elems[0x32] = 0;
    banner.french_title._M_elems[0x33] = 0;
    banner.french_title._M_elems[0x24] = 0;
    banner.french_title._M_elems[0x25] = 0;
    banner.french_title._M_elems[0x26] = 0;
    banner.french_title._M_elems[0x27] = 0;
    banner.french_title._M_elems[0x28] = 0;
    banner.french_title._M_elems[0x29] = 0;
    banner.french_title._M_elems[0x2a] = 0;
    banner.french_title._M_elems[0x2b] = 0;
    banner.french_title._M_elems[0x1c] = 0;
    banner.french_title._M_elems[0x1d] = 0;
    banner.french_title._M_elems[0x1e] = 0;
    banner.french_title._M_elems[0x1f] = 0;
    banner.french_title._M_elems[0x20] = 0;
    banner.french_title._M_elems[0x21] = 0;
    banner.french_title._M_elems[0x22] = 0;
    banner.french_title._M_elems[0x23] = 0;
    banner.french_title._M_elems[0x14] = 0;
    banner.french_title._M_elems[0x15] = 0;
    banner.french_title._M_elems[0x16] = 0;
    banner.french_title._M_elems[0x17] = 0;
    banner.french_title._M_elems[0x18] = 0;
    banner.french_title._M_elems[0x19] = 0;
    banner.french_title._M_elems[0x1a] = 0;
    banner.french_title._M_elems[0x1b] = 0;
    banner.french_title._M_elems[0xc] = 0;
    banner.french_title._M_elems[0xd] = 0;
    banner.french_title._M_elems[0xe] = 0;
    banner.french_title._M_elems[0xf] = 0;
    banner.french_title._M_elems[0x10] = 0;
    banner.french_title._M_elems[0x11] = 0;
    banner.french_title._M_elems[0x12] = 0;
    banner.french_title._M_elems[0x13] = 0;
    banner.french_title._M_elems[4] = 0;
    banner.french_title._M_elems[5] = 0;
    banner.french_title._M_elems[6] = 0;
    banner.french_title._M_elems[7] = 0;
    banner.french_title._M_elems[8] = 0;
    banner.french_title._M_elems[9] = 0;
    banner.french_title._M_elems[10] = 0;
    banner.french_title._M_elems[0xb] = 0;
    banner.english_title._M_elems[0x7c] = 0;
    banner.english_title._M_elems[0x7d] = 0;
    banner.english_title._M_elems[0x7e] = 0;
    banner.english_title._M_elems[0x7f] = 0;
    banner.french_title._M_elems[0] = 0;
    banner.french_title._M_elems[1] = 0;
    banner.french_title._M_elems[2] = 0;
    banner.french_title._M_elems[3] = 0;
    banner.german_title._M_elems[0x74] = 0;
    banner.german_title._M_elems[0x75] = 0;
    banner.german_title._M_elems[0x76] = 0;
    banner.german_title._M_elems[0x77] = 0;
    banner.german_title._M_elems[0x78] = 0;
    banner.german_title._M_elems[0x79] = 0;
    banner.german_title._M_elems[0x7a] = 0;
    banner.german_title._M_elems[0x7b] = 0;
    banner.german_title._M_elems[0x6c] = 0;
    banner.german_title._M_elems[0x6d] = 0;
    banner.german_title._M_elems[0x6e] = 0;
    banner.german_title._M_elems[0x6f] = 0;
    banner.german_title._M_elems[0x70] = 0;
    banner.german_title._M_elems[0x71] = 0;
    banner.german_title._M_elems[0x72] = 0;
    banner.german_title._M_elems[0x73] = 0;
    banner.german_title._M_elems[100] = 0;
    banner.german_title._M_elems[0x65] = 0;
    banner.german_title._M_elems[0x66] = 0;
    banner.german_title._M_elems[0x67] = 0;
    banner.german_title._M_elems[0x68] = 0;
    banner.german_title._M_elems[0x69] = 0;
    banner.german_title._M_elems[0x6a] = 0;
    banner.german_title._M_elems[0x6b] = 0;
    banner.german_title._M_elems[0x5c] = 0;
    banner.german_title._M_elems[0x5d] = 0;
    banner.german_title._M_elems[0x5e] = 0;
    banner.german_title._M_elems[0x5f] = 0;
    banner.german_title._M_elems[0x60] = 0;
    banner.german_title._M_elems[0x61] = 0;
    banner.german_title._M_elems[0x62] = 0;
    banner.german_title._M_elems[99] = 0;
    banner.german_title._M_elems[0x54] = 0;
    banner.german_title._M_elems[0x55] = 0;
    banner.german_title._M_elems[0x56] = 0;
    banner.german_title._M_elems[0x57] = 0;
    banner.german_title._M_elems[0x58] = 0;
    banner.german_title._M_elems[0x59] = 0;
    banner.german_title._M_elems[0x5a] = 0;
    banner.german_title._M_elems[0x5b] = 0;
    banner.german_title._M_elems[0x4c] = 0;
    banner.german_title._M_elems[0x4d] = 0;
    banner.german_title._M_elems[0x4e] = 0;
    banner.german_title._M_elems[0x4f] = 0;
    banner.german_title._M_elems[0x50] = 0;
    banner.german_title._M_elems[0x51] = 0;
    banner.german_title._M_elems[0x52] = 0;
    banner.german_title._M_elems[0x53] = 0;
    banner.german_title._M_elems[0x44] = 0;
    banner.german_title._M_elems[0x45] = 0;
    banner.german_title._M_elems[0x46] = 0;
    banner.german_title._M_elems[0x47] = 0;
    banner.german_title._M_elems[0x48] = 0;
    banner.german_title._M_elems[0x49] = 0;
    banner.german_title._M_elems[0x4a] = 0;
    banner.german_title._M_elems[0x4b] = 0;
    banner.german_title._M_elems[0x3c] = 0;
    banner.german_title._M_elems[0x3d] = 0;
    banner.german_title._M_elems[0x3e] = 0;
    banner.german_title._M_elems[0x3f] = 0;
    banner.german_title._M_elems[0x40] = 0;
    banner.german_title._M_elems[0x41] = 0;
    banner.german_title._M_elems[0x42] = 0;
    banner.german_title._M_elems[0x43] = 0;
    banner.german_title._M_elems[0x34] = 0;
    banner.german_title._M_elems[0x35] = 0;
    banner.german_title._M_elems[0x36] = 0;
    banner.german_title._M_elems[0x37] = 0;
    banner.german_title._M_elems[0x38] = 0;
    banner.german_title._M_elems[0x39] = 0;
    banner.german_title._M_elems[0x3a] = 0;
    banner.german_title._M_elems[0x3b] = 0;
    banner.german_title._M_elems[0x2c] = 0;
    banner.german_title._M_elems[0x2d] = 0;
    banner.german_title._M_elems[0x2e] = 0;
    banner.german_title._M_elems[0x2f] = 0;
    banner.german_title._M_elems[0x30] = 0;
    banner.german_title._M_elems[0x31] = 0;
    banner.german_title._M_elems[0x32] = 0;
    banner.german_title._M_elems[0x33] = 0;
    banner.german_title._M_elems[0x24] = 0;
    banner.german_title._M_elems[0x25] = 0;
    banner.german_title._M_elems[0x26] = 0;
    banner.german_title._M_elems[0x27] = 0;
    banner.german_title._M_elems[0x28] = 0;
    banner.german_title._M_elems[0x29] = 0;
    banner.german_title._M_elems[0x2a] = 0;
    banner.german_title._M_elems[0x2b] = 0;
    banner.german_title._M_elems[0x1c] = 0;
    banner.german_title._M_elems[0x1d] = 0;
    banner.german_title._M_elems[0x1e] = 0;
    banner.german_title._M_elems[0x1f] = 0;
    banner.german_title._M_elems[0x20] = 0;
    banner.german_title._M_elems[0x21] = 0;
    banner.german_title._M_elems[0x22] = 0;
    banner.german_title._M_elems[0x23] = 0;
    banner.german_title._M_elems[0x14] = 0;
    banner.german_title._M_elems[0x15] = 0;
    banner.german_title._M_elems[0x16] = 0;
    banner.german_title._M_elems[0x17] = 0;
    banner.german_title._M_elems[0x18] = 0;
    banner.german_title._M_elems[0x19] = 0;
    banner.german_title._M_elems[0x1a] = 0;
    banner.german_title._M_elems[0x1b] = 0;
    banner.german_title._M_elems[0xc] = 0;
    banner.german_title._M_elems[0xd] = 0;
    banner.german_title._M_elems[0xe] = 0;
    banner.german_title._M_elems[0xf] = 0;
    banner.german_title._M_elems[0x10] = 0;
    banner.german_title._M_elems[0x11] = 0;
    banner.german_title._M_elems[0x12] = 0;
    banner.german_title._M_elems[0x13] = 0;
    banner.german_title._M_elems[4] = 0;
    banner.german_title._M_elems[5] = 0;
    banner.german_title._M_elems[6] = 0;
    banner.german_title._M_elems[7] = 0;
    banner.german_title._M_elems[8] = 0;
    banner.german_title._M_elems[9] = 0;
    banner.german_title._M_elems[10] = 0;
    banner.german_title._M_elems[0xb] = 0;
    banner.french_title._M_elems[0x7c] = 0;
    banner.french_title._M_elems[0x7d] = 0;
    banner.french_title._M_elems[0x7e] = 0;
    banner.french_title._M_elems[0x7f] = 0;
    banner.german_title._M_elems[0] = 0;
    banner.german_title._M_elems[1] = 0;
    banner.german_title._M_elems[2] = 0;
    banner.german_title._M_elems[3] = 0;
    banner.italian_title._M_elems[0x74] = 0;
    banner.italian_title._M_elems[0x75] = 0;
    banner.italian_title._M_elems[0x76] = 0;
    banner.italian_title._M_elems[0x77] = 0;
    banner.italian_title._M_elems[0x78] = 0;
    banner.italian_title._M_elems[0x79] = 0;
    banner.italian_title._M_elems[0x7a] = 0;
    banner.italian_title._M_elems[0x7b] = 0;
    banner.italian_title._M_elems[0x6c] = 0;
    banner.italian_title._M_elems[0x6d] = 0;
    banner.italian_title._M_elems[0x6e] = 0;
    banner.italian_title._M_elems[0x6f] = 0;
    banner.italian_title._M_elems[0x70] = 0;
    banner.italian_title._M_elems[0x71] = 0;
    banner.italian_title._M_elems[0x72] = 0;
    banner.italian_title._M_elems[0x73] = 0;
    banner.italian_title._M_elems[100] = 0;
    banner.italian_title._M_elems[0x65] = 0;
    banner.italian_title._M_elems[0x66] = 0;
    banner.italian_title._M_elems[0x67] = 0;
    banner.italian_title._M_elems[0x68] = 0;
    banner.italian_title._M_elems[0x69] = 0;
    banner.italian_title._M_elems[0x6a] = 0;
    banner.italian_title._M_elems[0x6b] = 0;
    banner.italian_title._M_elems[0x5c] = 0;
    banner.italian_title._M_elems[0x5d] = 0;
    banner.italian_title._M_elems[0x5e] = 0;
    banner.italian_title._M_elems[0x5f] = 0;
    banner.italian_title._M_elems[0x60] = 0;
    banner.italian_title._M_elems[0x61] = 0;
    banner.italian_title._M_elems[0x62] = 0;
    banner.italian_title._M_elems[99] = 0;
    banner.italian_title._M_elems[0x54] = 0;
    banner.italian_title._M_elems[0x55] = 0;
    banner.italian_title._M_elems[0x56] = 0;
    banner.italian_title._M_elems[0x57] = 0;
    banner.italian_title._M_elems[0x58] = 0;
    banner.italian_title._M_elems[0x59] = 0;
    banner.italian_title._M_elems[0x5a] = 0;
    banner.italian_title._M_elems[0x5b] = 0;
    banner.italian_title._M_elems[0x4c] = 0;
    banner.italian_title._M_elems[0x4d] = 0;
    banner.italian_title._M_elems[0x4e] = 0;
    banner.italian_title._M_elems[0x4f] = 0;
    banner.italian_title._M_elems[0x50] = 0;
    banner.italian_title._M_elems[0x51] = 0;
    banner.italian_title._M_elems[0x52] = 0;
    banner.italian_title._M_elems[0x53] = 0;
    banner.italian_title._M_elems[0x44] = 0;
    banner.italian_title._M_elems[0x45] = 0;
    banner.italian_title._M_elems[0x46] = 0;
    banner.italian_title._M_elems[0x47] = 0;
    banner.italian_title._M_elems[0x48] = 0;
    banner.italian_title._M_elems[0x49] = 0;
    banner.italian_title._M_elems[0x4a] = 0;
    banner.italian_title._M_elems[0x4b] = 0;
    banner.italian_title._M_elems[0x3c] = 0;
    banner.italian_title._M_elems[0x3d] = 0;
    banner.italian_title._M_elems[0x3e] = 0;
    banner.italian_title._M_elems[0x3f] = 0;
    banner.italian_title._M_elems[0x40] = 0;
    banner.italian_title._M_elems[0x41] = 0;
    banner.italian_title._M_elems[0x42] = 0;
    banner.italian_title._M_elems[0x43] = 0;
    banner.italian_title._M_elems[0x34] = 0;
    banner.italian_title._M_elems[0x35] = 0;
    banner.italian_title._M_elems[0x36] = 0;
    banner.italian_title._M_elems[0x37] = 0;
    banner.italian_title._M_elems[0x38] = 0;
    banner.italian_title._M_elems[0x39] = 0;
    banner.italian_title._M_elems[0x3a] = 0;
    banner.italian_title._M_elems[0x3b] = 0;
    banner.italian_title._M_elems[0x2c] = 0;
    banner.italian_title._M_elems[0x2d] = 0;
    banner.italian_title._M_elems[0x2e] = 0;
    banner.italian_title._M_elems[0x2f] = 0;
    banner.italian_title._M_elems[0x30] = 0;
    banner.italian_title._M_elems[0x31] = 0;
    banner.italian_title._M_elems[0x32] = 0;
    banner.italian_title._M_elems[0x33] = 0;
    banner.italian_title._M_elems[0x24] = 0;
    banner.italian_title._M_elems[0x25] = 0;
    banner.italian_title._M_elems[0x26] = 0;
    banner.italian_title._M_elems[0x27] = 0;
    banner.italian_title._M_elems[0x28] = 0;
    banner.italian_title._M_elems[0x29] = 0;
    banner.italian_title._M_elems[0x2a] = 0;
    banner.italian_title._M_elems[0x2b] = 0;
    banner.italian_title._M_elems[0x1c] = 0;
    banner.italian_title._M_elems[0x1d] = 0;
    banner.italian_title._M_elems[0x1e] = 0;
    banner.italian_title._M_elems[0x1f] = 0;
    banner.italian_title._M_elems[0x20] = 0;
    banner.italian_title._M_elems[0x21] = 0;
    banner.italian_title._M_elems[0x22] = 0;
    banner.italian_title._M_elems[0x23] = 0;
    banner.italian_title._M_elems[0x14] = 0;
    banner.italian_title._M_elems[0x15] = 0;
    banner.italian_title._M_elems[0x16] = 0;
    banner.italian_title._M_elems[0x17] = 0;
    banner.italian_title._M_elems[0x18] = 0;
    banner.italian_title._M_elems[0x19] = 0;
    banner.italian_title._M_elems[0x1a] = 0;
    banner.italian_title._M_elems[0x1b] = 0;
    banner.italian_title._M_elems[0xc] = 0;
    banner.italian_title._M_elems[0xd] = 0;
    banner.italian_title._M_elems[0xe] = 0;
    banner.italian_title._M_elems[0xf] = 0;
    banner.italian_title._M_elems[0x10] = 0;
    banner.italian_title._M_elems[0x11] = 0;
    banner.italian_title._M_elems[0x12] = 0;
    banner.italian_title._M_elems[0x13] = 0;
    banner.italian_title._M_elems[4] = 0;
    banner.italian_title._M_elems[5] = 0;
    banner.italian_title._M_elems[6] = 0;
    banner.italian_title._M_elems[7] = 0;
    banner.italian_title._M_elems[8] = 0;
    banner.italian_title._M_elems[9] = 0;
    banner.italian_title._M_elems[10] = 0;
    banner.italian_title._M_elems[0xb] = 0;
    banner.german_title._M_elems[0x7c] = 0;
    banner.german_title._M_elems[0x7d] = 0;
    banner.german_title._M_elems[0x7e] = 0;
    banner.german_title._M_elems[0x7f] = 0;
    banner.italian_title._M_elems[0] = 0;
    banner.italian_title._M_elems[1] = 0;
    banner.italian_title._M_elems[2] = 0;
    banner.italian_title._M_elems[3] = 0;
    banner.spanish_title._M_elems[0x74] = 0;
    banner.spanish_title._M_elems[0x75] = 0;
    banner.spanish_title._M_elems[0x76] = 0;
    banner.spanish_title._M_elems[0x77] = 0;
    banner.spanish_title._M_elems[0x78] = 0;
    banner.spanish_title._M_elems[0x79] = 0;
    banner.spanish_title._M_elems[0x7a] = 0;
    banner.spanish_title._M_elems[0x7b] = 0;
    banner.spanish_title._M_elems[0x6c] = 0;
    banner.spanish_title._M_elems[0x6d] = 0;
    banner.spanish_title._M_elems[0x6e] = 0;
    banner.spanish_title._M_elems[0x6f] = 0;
    banner.spanish_title._M_elems[0x70] = 0;
    banner.spanish_title._M_elems[0x71] = 0;
    banner.spanish_title._M_elems[0x72] = 0;
    banner.spanish_title._M_elems[0x73] = 0;
    banner.spanish_title._M_elems[100] = 0;
    banner.spanish_title._M_elems[0x65] = 0;
    banner.spanish_title._M_elems[0x66] = 0;
    banner.spanish_title._M_elems[0x67] = 0;
    banner.spanish_title._M_elems[0x68] = 0;
    banner.spanish_title._M_elems[0x69] = 0;
    banner.spanish_title._M_elems[0x6a] = 0;
    banner.spanish_title._M_elems[0x6b] = 0;
    banner.spanish_title._M_elems[0x5c] = 0;
    banner.spanish_title._M_elems[0x5d] = 0;
    banner.spanish_title._M_elems[0x5e] = 0;
    banner.spanish_title._M_elems[0x5f] = 0;
    banner.spanish_title._M_elems[0x60] = 0;
    banner.spanish_title._M_elems[0x61] = 0;
    banner.spanish_title._M_elems[0x62] = 0;
    banner.spanish_title._M_elems[99] = 0;
    banner.spanish_title._M_elems[0x54] = 0;
    banner.spanish_title._M_elems[0x55] = 0;
    banner.spanish_title._M_elems[0x56] = 0;
    banner.spanish_title._M_elems[0x57] = 0;
    banner.spanish_title._M_elems[0x58] = 0;
    banner.spanish_title._M_elems[0x59] = 0;
    banner.spanish_title._M_elems[0x5a] = 0;
    banner.spanish_title._M_elems[0x5b] = 0;
    banner.spanish_title._M_elems[0x4c] = 0;
    banner.spanish_title._M_elems[0x4d] = 0;
    banner.spanish_title._M_elems[0x4e] = 0;
    banner.spanish_title._M_elems[0x4f] = 0;
    banner.spanish_title._M_elems[0x50] = 0;
    banner.spanish_title._M_elems[0x51] = 0;
    banner.spanish_title._M_elems[0x52] = 0;
    banner.spanish_title._M_elems[0x53] = 0;
    banner.spanish_title._M_elems[0x44] = 0;
    banner.spanish_title._M_elems[0x45] = 0;
    banner.spanish_title._M_elems[0x46] = 0;
    banner.spanish_title._M_elems[0x47] = 0;
    banner.spanish_title._M_elems[0x48] = 0;
    banner.spanish_title._M_elems[0x49] = 0;
    banner.spanish_title._M_elems[0x4a] = 0;
    banner.spanish_title._M_elems[0x4b] = 0;
    banner.spanish_title._M_elems[0x3c] = 0;
    banner.spanish_title._M_elems[0x3d] = 0;
    banner.spanish_title._M_elems[0x3e] = 0;
    banner.spanish_title._M_elems[0x3f] = 0;
    banner.spanish_title._M_elems[0x40] = 0;
    banner.spanish_title._M_elems[0x41] = 0;
    banner.spanish_title._M_elems[0x42] = 0;
    banner.spanish_title._M_elems[0x43] = 0;
    banner.spanish_title._M_elems[0x34] = 0;
    banner.spanish_title._M_elems[0x35] = 0;
    banner.spanish_title._M_elems[0x36] = 0;
    banner.spanish_title._M_elems[0x37] = 0;
    banner.spanish_title._M_elems[0x38] = 0;
    banner.spanish_title._M_elems[0x39] = 0;
    banner.spanish_title._M_elems[0x3a] = 0;
    banner.spanish_title._M_elems[0x3b] = 0;
    banner.spanish_title._M_elems[0x2c] = 0;
    banner.spanish_title._M_elems[0x2d] = 0;
    banner.spanish_title._M_elems[0x2e] = 0;
    banner.spanish_title._M_elems[0x2f] = 0;
    banner.spanish_title._M_elems[0x30] = 0;
    banner.spanish_title._M_elems[0x31] = 0;
    banner.spanish_title._M_elems[0x32] = 0;
    banner.spanish_title._M_elems[0x33] = 0;
    banner.spanish_title._M_elems[0x24] = 0;
    banner.spanish_title._M_elems[0x25] = 0;
    banner.spanish_title._M_elems[0x26] = 0;
    banner.spanish_title._M_elems[0x27] = 0;
    banner.spanish_title._M_elems[0x28] = 0;
    banner.spanish_title._M_elems[0x29] = 0;
    banner.spanish_title._M_elems[0x2a] = 0;
    banner.spanish_title._M_elems[0x2b] = 0;
    banner.spanish_title._M_elems[0x1c] = 0;
    banner.spanish_title._M_elems[0x1d] = 0;
    banner.spanish_title._M_elems[0x1e] = 0;
    banner.spanish_title._M_elems[0x1f] = 0;
    banner.spanish_title._M_elems[0x20] = 0;
    banner.spanish_title._M_elems[0x21] = 0;
    banner.spanish_title._M_elems[0x22] = 0;
    banner.spanish_title._M_elems[0x23] = 0;
    banner.spanish_title._M_elems[0x14] = 0;
    banner.spanish_title._M_elems[0x15] = 0;
    banner.spanish_title._M_elems[0x16] = 0;
    banner.spanish_title._M_elems[0x17] = 0;
    banner.spanish_title._M_elems[0x18] = 0;
    banner.spanish_title._M_elems[0x19] = 0;
    banner.spanish_title._M_elems[0x1a] = 0;
    banner.spanish_title._M_elems[0x1b] = 0;
    banner.spanish_title._M_elems[0xc] = 0;
    banner.spanish_title._M_elems[0xd] = 0;
    banner.spanish_title._M_elems[0xe] = 0;
    banner.spanish_title._M_elems[0xf] = 0;
    banner.spanish_title._M_elems[0x10] = 0;
    banner.spanish_title._M_elems[0x11] = 0;
    banner.spanish_title._M_elems[0x12] = 0;
    banner.spanish_title._M_elems[0x13] = 0;
    banner.spanish_title._M_elems[4] = 0;
    banner.spanish_title._M_elems[5] = 0;
    banner.spanish_title._M_elems[6] = 0;
    banner.spanish_title._M_elems[7] = 0;
    banner.spanish_title._M_elems[8] = 0;
    banner.spanish_title._M_elems[9] = 0;
    banner.spanish_title._M_elems[10] = 0;
    banner.spanish_title._M_elems[0xb] = 0;
    banner.italian_title._M_elems[0x7c] = 0;
    banner.italian_title._M_elems[0x7d] = 0;
    banner.italian_title._M_elems[0x7e] = 0;
    banner.italian_title._M_elems[0x7f] = 0;
    banner.spanish_title._M_elems[0] = 0;
    banner.spanish_title._M_elems[1] = 0;
    banner.spanish_title._M_elems[2] = 0;
    banner.spanish_title._M_elems[3] = 0;
    local_c88._0_2_ = local_338._0_2_;
    std::filesystem::__cxx11::path::path<std::__cxx11::wstring,std::filesystem::__cxx11::path>
              (&local_eb0,
               (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
               &specfile_data,auto_format);
    GetIconBitmap(&local_e88,&local_eb0);
    memcpy(banner.padding._M_elems + 0xe,&local_e88,0x200);
    std::filesystem::__cxx11::path::~path(&local_eb0);
    std::filesystem::__cxx11::path::path<std::__cxx11::wstring,std::filesystem::__cxx11::path>
              (&local_ef8,
               (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
               &specfile_data.field_0x20,auto_format);
    GetIconPalette(&local_ed0,&local_ef8);
    banner.palette._M_elems[8] = local_ed0._M_elems[0x10];
    banner.palette._M_elems[9] = local_ed0._M_elems[0x11];
    banner.palette._M_elems[10] = local_ed0._M_elems[0x12];
    banner.palette._M_elems[0xb] = local_ed0._M_elems[0x13];
    banner.palette._M_elems[0xc] = local_ed0._M_elems[0x14];
    banner.palette._M_elems[0xd] = local_ed0._M_elems[0x15];
    banner.palette._M_elems[0xe] = local_ed0._M_elems[0x16];
    banner.palette._M_elems[0xf] = local_ed0._M_elems[0x17];
    banner.palette._M_elems[0x10] = local_ed0._M_elems[0x18];
    banner.palette._M_elems[0x11] = local_ed0._M_elems[0x19];
    banner.palette._M_elems[0x12] = local_ed0._M_elems[0x1a];
    banner.palette._M_elems[0x13] = local_ed0._M_elems[0x1b];
    banner.palette._M_elems[0x14] = local_ed0._M_elems[0x1c];
    banner.palette._M_elems[0x15] = local_ed0._M_elems[0x1d];
    banner.palette._M_elems[0x16] = local_ed0._M_elems[0x1e];
    banner.palette._M_elems[0x17] = local_ed0._M_elems[0x1f];
    banner.bitmap._M_elems[0x1f8] = local_ed0._M_elems[0];
    banner.bitmap._M_elems[0x1f9] = local_ed0._M_elems[1];
    banner.bitmap._M_elems[0x1fa] = local_ed0._M_elems[2];
    banner.bitmap._M_elems[0x1fb] = local_ed0._M_elems[3];
    banner.bitmap._M_elems[0x1fc] = local_ed0._M_elems[4];
    banner.bitmap._M_elems[0x1fd] = local_ed0._M_elems[5];
    banner.bitmap._M_elems[0x1fe] = local_ed0._M_elems[6];
    banner.bitmap._M_elems[0x1ff] = local_ed0._M_elems[7];
    banner.palette._M_elems[0] = local_ed0._M_elems[8];
    banner.palette._M_elems[1] = local_ed0._M_elems[9];
    banner.palette._M_elems[2] = local_ed0._M_elems[10];
    banner.palette._M_elems[3] = local_ed0._M_elems[0xb];
    banner.palette._M_elems[4] = local_ed0._M_elems[0xc];
    banner.palette._M_elems[5] = local_ed0._M_elems[0xd];
    banner.palette._M_elems[6] = local_ed0._M_elems[0xe];
    banner.palette._M_elems[7] = local_ed0._M_elems[0xf];
    std::filesystem::__cxx11::path::~path(&local_ef8);
    iVar4 = std::__cxx11::
            basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>::begin
                      ((basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>
                        *)&specfile_data.field_0x40);
    iVar5 = std::__cxx11::
            basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>::end
                      ((basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>
                        *)&specfile_data.field_0x40);
    pvVar6 = std::array<unsigned_short,_128UL>::data
                       ((array<unsigned_short,_128UL> *)(banner.palette._M_elems + 0x18));
    std::copy<__gnu_cxx::__normal_iterator<char16_t*,std::__cxx11::u16string>,unsigned_short*>
              ((__normal_iterator<char16_t_*,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>
                )iVar4._M_current,
               (__normal_iterator<char16_t_*,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>
                )iVar5._M_current,pvVar6);
    pbVar1 = (basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> *)
             ((long)&specfile_data.japanese_title.field_2 + 8);
    iVar4 = std::__cxx11::
            basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>::begin
                      (pbVar1);
    iVar5 = std::__cxx11::
            basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>::end
                      (pbVar1);
    pvVar6 = std::array<unsigned_short,_128UL>::data
                       ((array<unsigned_short,_128UL> *)(banner.japanese_title._M_elems + 0x7c));
    std::copy<__gnu_cxx::__normal_iterator<char16_t*,std::__cxx11::u16string>,unsigned_short*>
              ((__normal_iterator<char16_t_*,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>
                )iVar4._M_current,
               (__normal_iterator<char16_t_*,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>
                )iVar5._M_current,pvVar6);
    pbVar1 = (basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> *)
             ((long)&specfile_data.english_title.field_2 + 8);
    iVar4 = std::__cxx11::
            basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>::begin
                      (pbVar1);
    iVar5 = std::__cxx11::
            basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>::end
                      (pbVar1);
    pvVar6 = std::array<unsigned_short,_128UL>::data
                       ((array<unsigned_short,_128UL> *)(banner.english_title._M_elems + 0x7c));
    std::copy<__gnu_cxx::__normal_iterator<char16_t*,std::__cxx11::u16string>,unsigned_short*>
              ((__normal_iterator<char16_t_*,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>
                )iVar4._M_current,
               (__normal_iterator<char16_t_*,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>
                )iVar5._M_current,pvVar6);
    pbVar1 = (basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> *)
             ((long)&specfile_data.french_title.field_2 + 8);
    iVar4 = std::__cxx11::
            basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>::begin
                      (pbVar1);
    iVar5 = std::__cxx11::
            basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>::end
                      (pbVar1);
    pvVar6 = std::array<unsigned_short,_128UL>::data
                       ((array<unsigned_short,_128UL> *)(banner.french_title._M_elems + 0x7c));
    std::copy<__gnu_cxx::__normal_iterator<char16_t*,std::__cxx11::u16string>,unsigned_short*>
              ((__normal_iterator<char16_t_*,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>
                )iVar4._M_current,
               (__normal_iterator<char16_t_*,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>
                )iVar5._M_current,pvVar6);
    pbVar1 = (basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> *)
             ((long)&specfile_data.german_title.field_2 + 8);
    iVar4 = std::__cxx11::
            basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>::begin
                      (pbVar1);
    iVar5 = std::__cxx11::
            basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>::end
                      (pbVar1);
    pvVar6 = std::array<unsigned_short,_128UL>::data
                       ((array<unsigned_short,_128UL> *)(banner.german_title._M_elems + 0x7c));
    std::copy<__gnu_cxx::__normal_iterator<char16_t*,std::__cxx11::u16string>,unsigned_short*>
              ((__normal_iterator<char16_t_*,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>
                )iVar4._M_current,
               (__normal_iterator<char16_t_*,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>
                )iVar5._M_current,pvVar6);
    pbVar1 = (basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> *)
             ((long)&specfile_data.italian_title.field_2 + 8);
    iVar4 = std::__cxx11::
            basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>::begin
                      (pbVar1);
    iVar5 = std::__cxx11::
            basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>::end
                      (pbVar1);
    pvVar6 = std::array<unsigned_short,_128UL>::data
                       ((array<unsigned_short,_128UL> *)(banner.italian_title._M_elems + 0x7c));
    std::copy<__gnu_cxx::__normal_iterator<char16_t*,std::__cxx11::u16string>,unsigned_short*>
              ((__normal_iterator<char16_t_*,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>
                )iVar4._M_current,
               (__normal_iterator<char16_t_*,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>
                )iVar5._M_current,pvVar6);
    banner_data = std::array<unsigned_char,_512UL>::data
                            ((array<unsigned_char,_512UL> *)(banner.padding._M_elems + 0xe));
    local_c88._2_2_ = CalculateCRC16FromBannerData(banner_data);
    OutputBanner((ofstream *)local_220,(Banner *)local_c88);
    specfile_data.spanish_title.field_2._8_4_ = 1;
    SpecFileData::~SpecFileData((SpecFileData *)local_338);
  }
  else {
    pvVar3 = std::filesystem::__cxx11::path::c_str(outfile_path);
    printf("error: could not open %s for writing\n",pvVar3);
    specfile_data.spanish_title.field_2._8_4_ = 1;
  }
  std::ofstream::~ofstream(local_220);
  return bVar7;
}

Assistant:

bool MakeBanner(const std::filesystem::path& specfile_path, const std::filesystem::path& outfile_path) {
    std::ofstream ostream(outfile_path, std::ios::binary);
    if (!ostream.is_open()) {
#ifdef _MSC_VER
        printf("error: could not open %ls for writing\n", outfile_path.c_str());
#else
        printf("error: could not open %s for writing\n", outfile_path.c_str());
#endif
        return false;
    }

    SpecFileData specfile_data = {};
    try {
        specfile_data = ParseSpecFile(specfile_path);
    } catch (std::runtime_error& e) {
        printf("error: %s\n", e.what());
        return false;
    }

    Banner banner = {};

    banner.version = specfile_data.version;
    banner.bitmap = GetIconBitmap(specfile_data.icon_bitmap_filename);
    banner.palette = GetIconPalette(specfile_data.icon_palette_filename);

    std::copy(specfile_data.japanese_title.begin(), specfile_data.japanese_title.end(), banner.japanese_title.data());
    std::copy(specfile_data.english_title.begin(), specfile_data.english_title.end(), banner.english_title.data());
    std::copy(specfile_data.french_title.begin(), specfile_data.french_title.end(), banner.french_title.data());
    std::copy(specfile_data.german_title.begin(), specfile_data.german_title.end(), banner.german_title.data());
    std::copy(specfile_data.italian_title.begin(), specfile_data.italian_title.end(), banner.italian_title.data());
    std::copy(specfile_data.spanish_title.begin(), specfile_data.spanish_title.end(), banner.spanish_title.data());

    // checksum the banner data, starting from the icon bitmap and ending at the end of the file.
    banner.crc = CalculateCRC16FromBannerData(banner.bitmap.data());

    // check against diamond's icon crc
    // if (banner.crc != 0x048B) {
    //     printf("CRC did not match (expected 0x048B, got 0x%04X)\n", banner.crc);
    // } else {
    //     printf("CRC matched\n");
    // }

    OutputBanner(ostream, banner);
    return true;
}